

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeStartFaceConfiguration
          (MeshEdgebreakerTraversalDecoder *this)

{
  bool bVar1;
  uint16_t uVar2;
  DecoderBuffer *in_RDI;
  uint32_t face_configuration;
  undefined4 in_stack_fffffffffffffff0;
  uint in_stack_fffffffffffffff4;
  DecoderBuffer *this_00;
  
  this_00 = in_RDI;
  uVar2 = DecoderBuffer::bitstream_version(in_RDI);
  if (uVar2 < 0x202) {
    DecoderBuffer::DecodeLeastSignificantBits32
              (this_00,in_stack_fffffffffffffff4,(uint32_t *)in_RDI);
  }
  else {
    bVar1 = RAnsBitDecoder::DecodeNextBit
                      ((RAnsBitDecoder *)
                       CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    in_stack_fffffffffffffff4 = (uint)bVar1;
  }
  return in_stack_fffffffffffffff4 != 0;
}

Assistant:

inline bool DecodeStartFaceConfiguration() {
    uint32_t face_configuration;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (buffer_.bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
      start_face_buffer_.DecodeLeastSignificantBits32(1, &face_configuration);

    } else
#endif
    {
      face_configuration = start_face_decoder_.DecodeNextBit();
    }
    return face_configuration;
  }